

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpre.c
# Opt level: O0

ssize_t mpt_qpre(mpt_queue *queue,size_t len)

{
  size_t total;
  size_t high;
  size_t low;
  size_t len_local;
  mpt_queue *queue_local;
  
  low = len;
  len_local = (size_t)queue;
  mpt_queue_empty(queue,&high,&total);
  if (high + total < low) {
    queue_local = (mpt_queue *)0xffffffffffffffef;
  }
  else {
    if ((total == 0) || (low <= total)) {
      if (low < *(ulong *)(len_local + 0x18)) {
        *(size_t *)(len_local + 0x18) = *(long *)(len_local + 0x18) - low;
      }
      else {
        *(size_t *)(len_local + 0x18) =
             (*(long *)(len_local + 0x10) - low) + *(long *)(len_local + 0x18);
      }
    }
    else {
      *(size_t *)(len_local + 0x18) = *(long *)(len_local + 0x10) - (low - total);
    }
    *(size_t *)(len_local + 8) = low + *(long *)(len_local + 8);
    queue_local = (mpt_queue *)(((high + total) - low) / low);
  }
  return (ssize_t)queue_local;
}

Assistant:

extern ssize_t mpt_qpre(MPT_STRUCT(queue) *queue, size_t len)
{
	size_t low, high, total;
	
	mpt_queue_empty(queue, &low, &high);
	total = low + high;
	
	/* not enough remaining space */
	if (len > total) {
		return MPT_ERROR(MissingBuffer);
	}
	/* data element wraps around upper border */
	if (high && high < len) {
		queue->off = queue->max - (len - high);
	}
	else {
		if (len < queue->off) queue->off -= len;
		else queue->off += queue->max - len;
	}
	total -= len;
	queue->len += len;
	
	return total / len;
}